

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O1

int nn_condvar_init(nn_condvar_t *cond)

{
  int iVar1;
  
  iVar1 = pthread_cond_init((pthread_cond_t *)cond,(pthread_condattr_t *)0x0);
  return -iVar1;
}

Assistant:

int nn_condvar_init (nn_condvar_t *cond)
{
    int rc;

    /* This should really never fail, but the system may do so for
       ENOMEM or EAGAIN due to resource exhaustion, or EBUSY if reusing
       a condition variable with no intervening destroy call. */
    rc = pthread_cond_init (&cond->cv, NULL);
    return (-rc);
}